

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::escape_basic_string
          (serializer<toml::type_config> *this,string_type *s)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int c2;
  int c1;
  char_type c;
  const_iterator __end0;
  const_iterator __begin0;
  string_type *__range3;
  string_type *retval;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RSI);
  local_28 = local_18;
  local_30._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(this_00);
  while (bVar2 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    cVar1 = *pcVar3;
    in_stack_fffffffffffffe4c = (int)cVar1;
    if (in_stack_fffffffffffffe4c == 8) {
      string_conv<std::__cxx11::string,3ul>((char (*) [3])CONCAT44(8,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if (in_stack_fffffffffffffe4c == 9) {
      string_conv<std::__cxx11::string,3ul>((char (*) [3])CONCAT44(9,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if (in_stack_fffffffffffffe4c == 10) {
      string_conv<std::__cxx11::string,3ul>((char (*) [3])CONCAT44(10,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if (in_stack_fffffffffffffe4c == 0xc) {
      string_conv<std::__cxx11::string,3ul>((char (*) [3])CONCAT44(0xc,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if (in_stack_fffffffffffffe4c == 0xd) {
      string_conv<std::__cxx11::string,3ul>((char (*) [3])CONCAT44(0xd,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if (in_stack_fffffffffffffe4c == 0x22) {
      string_conv<std::__cxx11::string,3ul>((char (*) [3])CONCAT44(0x22,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if (in_stack_fffffffffffffe4c == 0x5c) {
      string_conv<std::__cxx11::string,3ul>((char (*) [3])CONCAT44(0x5c,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if ((cVar1 == '\x1b') && (((in_RSI->field_2)._M_local_buf[0] & 1U) != 0)) {
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::__cxx11::string::~string(in_RDI);
    }
    else if (((cVar1 < '\0') || ('\b' < cVar1)) &&
            (((cVar1 < '\n' || ('\x1f' < cVar1)) && (cVar1 != '\x7f')))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,cVar1 >> 7);
    }
    else {
      if (((in_RSI->field_2)._M_local_buf[1] & 1U) == 0) {
        string_conv<std::__cxx11::string,5ul>
                  ((char (*) [5])CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::__cxx11::string::~string(in_RDI);
      }
      else {
        string_conv<std::__cxx11::string,3ul>
                  ((char (*) [3])CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::__cxx11::string::~string(in_RDI);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(char)((uint)in_stack_fffffffffffffe4c >> 0x18));
      __c = (char)((uint)in_stack_fffffffffffffe4c >> 0x18);
      if ((int)cVar1 % 0x10 < 10) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_RDI,__c);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_RDI,__c);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return this_00;
}

Assistant:

string_type escape_basic_string(const string_type& s) const // {{{
    {
        string_type retval;
        for(const char_type c : s)
        {
            switch(c)
            {
                case char_type('\\'): {retval += string_conv<string_type>("\\\\"); break;}
                case char_type('\"'): {retval += string_conv<string_type>("\\\""); break;}
                case char_type('\b'): {retval += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {retval += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {retval += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {retval += string_conv<string_type>("\\n" ); break;}
                case char_type('\r'): {retval += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    if(c == char_type(0x1B) && spec_.v1_1_0_add_escape_sequence_e)
                    {
                        retval += string_conv<string_type>("\\e");
                    }
                    else if((char_type(0x00) <= c && c <= char_type(0x08)) ||
                            (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                             c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            retval += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            retval += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        retval += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            retval += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            retval += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        retval += c;
                    }
                }
            }
        }
        return retval;
    }